

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O2

void __thiscall
Js::FunctionCodeGenRuntimeData::SetupRecursiveInlineeChain
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionBody *inlinee)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  Recycler *this_00;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar5;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x46,"(recycler)","recycler");
    if (!bVar2) goto LAB_00893b97;
    *puVar3 = 0;
  }
  pFVar4 = (this->functionBody).ptr;
  if (pFVar4->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x47,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar2) goto LAB_00893b97;
    *puVar3 = 0;
    pFVar4 = (this->functionBody).ptr;
  }
  if (pFVar4 != inlinee) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x48,"(inlinee == functionBody)","inlinee == functionBody");
    if (!bVar2) {
LAB_00893b97:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pWVar5 = (this->inlinees).ptr;
  if (pWVar5 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    data.plusSize = (size_t)((this->functionBody).ptr)->profiledCallSiteCount;
    local_58 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_49c6d22;
    data.filename._0_4_ = 0x4b;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    pWVar5 = Memory::
             AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>,false>
                       ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocZero,0,
                        (ulong)((this->functionBody).ptr)->profiledCallSiteCount);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>_>::
    WriteBarrierSet(&this->inlinees,pWVar5);
    pWVar5 = (this->inlinees).ptr;
  }
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierSet
            (pWVar5 + profiledCallSiteId,this);
  return;
}

Assistant:

void FunctionCodeGenRuntimeData::SetupRecursiveInlineeChain(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee == functionBody);
        if (!inlinees)
        {
            inlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData*), functionBody->GetProfiledCallSiteCount());
        }
        inlinees[profiledCallSiteId] = this;
    }